

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_ResizeActuallyResizes_Test
          (HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}